

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O1

void __thiscall
perfetto::protos::gen::TraceConfig_DataSource::TraceConfig_DataSource
          (TraceConfig_DataSource *this,TraceConfig_DataSource *param_1)

{
  pointer pcVar1;
  pointer *__ptr;
  
  (this->super_CppMessageObj)._vptr_CppMessageObj =
       (_func_int **)&PTR__TraceConfig_DataSource_003c7c80;
  protozero::CopyablePtr<perfetto::protos::gen::DataSourceConfig>::CopyablePtr
            (&this->config_,&param_1->config_);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->producer_name_filter_,&param_1->producer_name_filter_);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->producer_name_regex_filter_,&param_1->producer_name_regex_filter_);
  (this->unknown_fields_)._M_dataplus._M_p = (pointer)&(this->unknown_fields_).field_2;
  pcVar1 = (param_1->unknown_fields_)._M_dataplus._M_p;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&this->unknown_fields_,pcVar1,
             pcVar1 + (param_1->unknown_fields_)._M_string_length);
  (this->_has_field_).super__Base_bitset<1UL>._M_w =
       (param_1->_has_field_).super__Base_bitset<1UL>._M_w;
  return;
}

Assistant:

TraceConfig_DataSource::TraceConfig_DataSource(const TraceConfig_DataSource&) = default;